

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

String * capnp::compiler::expressionString(Reader name)

{
  char *pcVar1;
  size_t sVar2;
  Branch *pBVar3;
  int iVar4;
  String *pSVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  String *in_RDI;
  undefined1 in_stack_00000190 [48];
  StringTree local_48;
  
  expressionStringTree((Reader)in_stack_00000190);
  pSVar5 = kj::StringTree::flatten(in_RDI,&local_48);
  sVar2 = local_48.branches.size_;
  pBVar3 = local_48.branches.ptr;
  if (local_48.branches.ptr != (Branch *)0x0) {
    local_48.branches.ptr = (Branch *)0x0;
    local_48.branches.size_ = 0;
    iVar4 = (**(local_48.branches.disposer)->_vptr_ArrayDisposer)
                      (local_48.branches.disposer,pBVar3,0x40,sVar2,sVar2,
                       kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    pSVar5 = (String *)CONCAT44(extraout_var,iVar4);
  }
  sVar2 = local_48.text.content.size_;
  pcVar1 = local_48.text.content.ptr;
  if (local_48.text.content.ptr != (char *)0x0) {
    local_48.text.content.ptr = (char *)0x0;
    local_48.text.content.size_ = 0;
    iVar4 = (**(local_48.text.content.disposer)->_vptr_ArrayDisposer)
                      (local_48.text.content.disposer,pcVar1,1,sVar2,sVar2,0);
    pSVar5 = (String *)CONCAT44(extraout_var_00,iVar4);
  }
  return pSVar5;
}

Assistant:

static kj::String expressionString(Expression::Reader name) {
  return expressionStringTree(name).flatten();
}